

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_pipeline_layout_handle
          (Impl *this,VkPipelineLayout layout,VkPipelineLayout *out_layout)

{
  bool bVar1;
  LogLevel LVar2;
  pointer pvVar3;
  VkPipelineLayout_T *pVVar4;
  _Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false> local_30;
  const_iterator itr;
  VkPipelineLayout *out_layout_local;
  VkPipelineLayout layout_local;
  Impl *this_local;
  
  if (layout == (VkPipelineLayout)0x0) {
    *out_layout = (VkPipelineLayout)0x0;
    this_local._7_1_ = true;
  }
  else {
    itr.super__Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>._M_cur
         = (_Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>)
           (_Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>)
           out_layout;
    out_layout_local = (VkPipelineLayout *)layout;
    layout_local = (VkPipelineLayout)this;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<VkPipelineLayout_T_*,_unsigned_long,_std::hash<VkPipelineLayout_T_*>,_std::equal_to<VkPipelineLayout_T_*>,_std::allocator<std::pair<VkPipelineLayout_T_*const,_unsigned_long>_>_>
         ::find(&this->pipeline_layout_to_hash,(key_type *)&out_layout_local);
    local_38._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<VkPipelineLayout_T*,unsigned_long,std::hash<VkPipelineLayout_T*>,std::equal_to<VkPipelineLayout_T*>,std::allocator<std::pair<VkPipelineLayout_T*const,unsigned_long>>>>
                   (&this->pipeline_layout_to_hash);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (bVar1) {
      LVar2 = get_thread_log_level();
      if (((int)LVar2 < 2) &&
         (bVar1 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Cannot find pipeline layout in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                            ), !bVar1)) {
        fprintf(_stderr,
                "Fossilize WARN: Cannot find pipeline layout in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
               );
      }
      this_local._7_1_ = false;
    }
    else {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false,_false>
                             *)&local_30);
      pVVar4 = api_object_cast<VkPipelineLayout_T*,unsigned_long>(pvVar3->second);
      *(VkPipelineLayout_T **)
       itr.super__Node_iterator_base<std::pair<VkPipelineLayout_T_*const,_unsigned_long>,_false>.
       _M_cur = pVVar4;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::remap_pipeline_layout_handle(VkPipelineLayout layout, VkPipelineLayout *out_layout) const
{
	if (layout == VK_NULL_HANDLE)
	{
		// This is allowed in VK_EXT_graphics_pipeline_library.
		*out_layout = VK_NULL_HANDLE;
		return true;
	}

	auto itr = pipeline_layout_to_hash.find(layout);
	if (itr == end(pipeline_layout_to_hash))
	{
		LOGW_LEVEL("Cannot find pipeline layout in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_layout = api_object_cast<VkPipelineLayout>(uint64_t(itr->second));
		return true;
	}
}